

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcmalloc_unittest.cc
# Opt level: O3

void __thiscall TCMallocTest_Version_Test::TestBody(TCMallocTest_Version_Test *this)

{
  int iVar1;
  char *pcVar2;
  char local_a8 [8];
  char mmp [64];
  undefined8 local_60;
  char *patch;
  uint local_50;
  int major;
  int minor;
  int used;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_40;
  AssertHelper local_38;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_30;
  
  pcVar2 = (char *)tc_version((long)&patch + 4,&local_50,&local_60);
  major = snprintf(local_a8,0x40,"gperftools %d.%d%s",(ulong)patch._4_4_,(ulong)local_50,local_60);
  local_30._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x40;
  testing::internal::CmpHelperLT<int,unsigned_long>
            ((internal *)&minor,"used","sizeof(mmp)",&major,(unsigned_long *)&local_30);
  if ((char)minor == '\0') {
    testing::Message::Message((Message *)&local_30);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x6bd,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
  }
  else {
    if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_40,local_40);
    }
    iVar1 = strcmp("gperftools 2.16.90",pcVar2);
    local_30._M_head_impl._0_4_ = iVar1;
    local_38.data_._0_4_ = 0;
    testing::internal::CmpHelperEQ<int,int>
              ((internal *)&minor,"strcmp(\"gperftools 2.16.90\", human_version)","0",
               (int *)&local_30,(int *)&local_38);
    if ((char)minor != '\0') goto LAB_001147f1;
    testing::Message::Message((Message *)&local_30);
    if (local_40 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = (local_40->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/alk[P]gperftools/src/tests/tcmalloc_unittest.cc"
               ,0x6be,pcVar2);
    testing::internal::AssertHelper::operator=(&local_38,(Message *)&local_30);
  }
  testing::internal::AssertHelper::~AssertHelper(&local_38);
  if (local_30._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_30._M_head_impl + 8))();
  }
LAB_001147f1:
  if (local_40 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_40,local_40);
  }
  return;
}

Assistant:

TEST(TCMallocTest, Version) {
  // Test tc_version()
  int major;
  int minor;
  const char* patch;
  char mmp[64];
  const char* human_version = tc_version(&major, &minor, &patch);
  int used = snprintf(mmp, sizeof(mmp), "gperftools %d.%d%s", major, minor, patch);
  ASSERT_LT(used, sizeof(mmp));
  ASSERT_EQ(strcmp(TC_VERSION_STRING, human_version), 0);
}